

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

void Kit_DsdTruthPartial(Kit_DsdMan_t *p,Kit_DsdNtk_t *pNtk,uint *pTruthRes,uint uSupp)

{
  undefined2 uVar1;
  uint *puVar2;
  ulong uVar3;
  uint uVar4;
  
  puVar2 = Kit_DsdTruthComputeOne(p,pNtk,uSupp);
  uVar1 = pNtk->nVars;
  uVar4 = 1 << ((char)uVar1 - 5U & 0x1f);
  if ((ushort)uVar1 < 6) {
    uVar4 = 1;
  }
  if (0 < (int)uVar4) {
    uVar3 = (ulong)uVar4 + 1;
    do {
      pTruthRes[uVar3 - 2] = puVar2[uVar3 - 2];
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
  }
  return;
}

Assistant:

void Kit_DsdTruthPartial( Kit_DsdMan_t * p, Kit_DsdNtk_t * pNtk, unsigned * pTruthRes, unsigned uSupp )
{
    unsigned * pTruth = Kit_DsdTruthComputeOne( p, pNtk, uSupp );
    Kit_TruthCopy( pTruthRes, pTruth, pNtk->nVars );
/*
    // verification
    {
        // compute the same function using different procedure
        unsigned * pTruthTemp = Vec_PtrEntry(p->vTtNodes, pNtk->nVars + pNtk->nNodes + 1);
        pNtk->pSupps = NULL;
        Kit_DsdTruthComputeTwo( p, pNtk, uSupp, -1, pTruthTemp );
//        if ( !Kit_TruthIsEqual( pTruthTemp, pTruthRes, pNtk->nVars ) )
        if ( !Kit_TruthIsEqualWithPhase( pTruthTemp, pTruthRes, pNtk->nVars ) )
        {
            printf( "Verification FAILED!\n" );
            Kit_DsdPrint( stdout, pNtk );
            Kit_DsdPrintFromTruth( pTruthRes, pNtk->nVars );
            Kit_DsdPrintFromTruth( pTruthTemp, pNtk->nVars );
        }
//        else
//            printf( "Verification successful.\n" );
    }
*/
}